

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_IncrementalSolverInterface_T.h
# Opt level: O0

shared_ptr<JointPolicyDiscretePure> __thiscall
BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>::GetNewJpol
          (BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> *this)

{
  bool bVar1;
  Index IVar2;
  type pJVar3;
  type this_00;
  shared_count extraout_RDX;
  I_PtPDpure_constPtr *in_RDI;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> sVar4;
  shared_ptr<JointPolicyDiscretePure> sVar5;
  shared_ptr<const_JointPolicyDiscretePure> pastJpol;
  shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG;
  shared_ptr<JointPolicyPureVector> jpol;
  JPPVfCBG_constPtr *in_stack_fffffffffffffed8;
  shared_ptr<const_BayesianGameWithClusterInfo> *this_01;
  shared_ptr<JointPolicyPureVector> *in_stack_fffffffffffffef8;
  shared_ptr<JointPolicyPureVector> *in_stack_ffffffffffffff00;
  shared_ptr<JointPolicyPureVectorForClusteredBG> *this_02;
  I_PtPDpure_constPtr *this_03;
  shared_ptr<const_BayesianGameWithClusterInfo> local_a8;
  shared_ptr<const_JointPolicyDiscretePure> local_98;
  shared_ptr<const_BayesianGameWithClusterInfo> local_88 [2];
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_68;
  undefined1 local_55;
  undefined1 local_40 [16];
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_30;
  undefined1 local_20 [32];
  
  this_03 = in_RDI;
  operator_new(0x98);
  local_55 = 1;
  sVar4 = BayesianGameIdenticalPayoffSolver::GetBGIPI
                    ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffed8);
  boost::shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
  shared_ptr<BayesianGameIdenticalPayoffInterface_const>(&local_30,local_40,sVar4.pn.pi_.pi_);
  JointPolicyPureVector::JointPolicyPureVector((JointPolicyPureVector *)this_03,in_RDI);
  local_55 = 0;
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
            (in_stack_ffffffffffffff00,(JointPolicyPureVector *)in_stack_fffffffffffffef8);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x147c05);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x147c12);
  boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
            (in_stack_fffffffffffffef8);
  bVar1 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)&local_68);
  if (bVar1) {
    this_02 = &local_68;
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(this_02);
    this_01 = local_88;
    JointPolicyPureVectorForClusteredBG::GetBG
              ((JointPolicyPureVectorForClusteredBG *)in_stack_fffffffffffffed8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(this_01);
    BayesianGameWithClusterInfo::GetPastJointPolicyPVFCBG
              ((BayesianGameWithClusterInfo *)in_stack_fffffffffffffed8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x147c8d);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(this_02);
    boost::
    dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG_const,JointPolicyDiscretePure_const>
              (&local_98);
    JointPolicyPureVectorForClusteredBG::SetPrevJPPVfCBG
              ((JointPolicyPureVectorForClusteredBG *)this_01,in_stack_fffffffffffffed8);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x147ccc);
    pJVar3 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(this_02);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(this_02);
    JointPolicyPureVectorForClusteredBG::GetBG
              ((JointPolicyPureVectorForClusteredBG *)in_stack_fffffffffffffed8);
    this_00 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_a8);
    IVar2 = BayesianGameForDecPOMDPStageInterface::GetStage
                      ((BayesianGameForDecPOMDPStageInterface *)this_00);
    (**(code **)(*(long *)pJVar3 + 0x10))(pJVar3,IVar2);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x147d2d);
    boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_JointPolicyDiscretePure> *)0x147d3a);
  }
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyPureVector>
            ((shared_ptr<JointPolicyDiscretePure> *)in_RDI,local_20);
  boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x147df6);
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x147e03);
  sVar5.pn.pi_ = extraout_RDX.pi_;
  sVar5.px = (element_type *)this_03;
  return sVar5;
}

Assistant:

virtual boost::shared_ptr<JointPolicyDiscretePure> GetNewJpol() const
    //boost::shared_ptr<JP> GetNewJpol() const
    {
        boost::shared_ptr<JP> jpol = boost::shared_ptr<JP>(new JP(this->GetBGIPI()));
        // check whether it is a
        // JointPolicyPureVectorForClusteredBG, because then we
        // need to store more things
        boost::shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG=
            boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(jpol);
        if(JPPVfCBG)
        {
            boost::shared_ptr<const JointPolicyDiscretePure> pastJpol =
                JPPVfCBG->GetBG()->GetPastJointPolicyPVFCBG();
            JPPVfCBG->SetPrevJPPVfCBG(
                boost::dynamic_pointer_cast<const JointPolicyPureVectorForClusteredBG>(pastJpol));
            JPPVfCBG->SetDepth(JPPVfCBG->GetBG()->GetStage());
        }
        return(jpol);
    }